

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SetRepeatedString
          (Reflection *this,Message *message,FieldDescriptor *field,int index,string *value)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int index_00;
  Descriptor *pDVar4;
  string *value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  int in_ECX;
  FieldDescriptor *in_RDX;
  long *in_RDI;
  string *in_R8;
  char *in_stack_00000008;
  char *in_stack_00000010;
  undefined4 in_stack_00000018;
  CppType in_stack_0000001c;
  Descriptor *in_stack_00000020;
  FieldDescriptor *in_stack_00000028;
  Descriptor *in_stack_00000030;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  Reflection *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  Reflection *in_stack_ffffffffffffff90;
  ExtensionSet *this_00;
  ExtensionSet local_48;
  int local_1c;
  FieldDescriptor *local_18;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  pDVar4 = FieldDescriptor::containing_type(in_RDX);
  if (pDVar4 != (Descriptor *)*in_RDI) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000020,(FieldDescriptor *)CONCAT44(in_stack_0000001c,in_stack_00000018),
               in_stack_00000010,in_stack_00000008);
  }
  LVar2 = FieldDescriptor::label(local_18);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000020,(FieldDescriptor *)CONCAT44(in_stack_0000001c,in_stack_00000018),
               in_stack_00000010,in_stack_00000008);
  }
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x421651);
  if (CVar3 != CPPTYPE_STRING) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (in_stack_00000030,in_stack_00000028,(char *)in_stack_00000020,in_stack_0000001c);
  }
  bVar1 = FieldDescriptor::is_extension(local_18);
  if (bVar1) {
    value_00 = (string *)
               MutableExtensionSet(in_stack_ffffffffffffff80,
                                   (Message *)
                                   CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    index_00 = FieldDescriptor::number(local_18);
    this_00 = &local_48;
    std::__cxx11::string::string((string *)this_00,in_R8);
    internal::ExtensionSet::SetRepeatedString(this_00,local_1c,index_00,value_00);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    FieldDescriptor::options(local_18);
    FieldOptions::ctype((FieldOptions *)0x421713);
    pbVar5 = MutableRepeatedField<std::__cxx11::string>
                       (in_stack_ffffffffffffff90,
                        (Message *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                        (FieldDescriptor *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    std::__cxx11::string::assign((string *)pbVar5);
  }
  return;
}

Assistant:

void Reflection::SetRepeatedString(Message* message,
                                   const FieldDescriptor* field, int index,
                                   std::string value) const {
  USAGE_CHECK_ALL(SetRepeatedString, REPEATED, STRING);
  if (field->is_extension()) {
    MutableExtensionSet(message)->SetRepeatedString(field->number(), index,
                                                    std::move(value));
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING:
        MutableRepeatedField<std::string>(message, field, index)->assign(std::move(value));
        break;
    }
  }
}